

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecdsa_test.cc
# Opt level: O2

void __thiscall ECDSATest_BuiltinCurves_Test::TestBody(ECDSATest_BuiltinCurves_Test *this)

{
  undefined8 __p;
  int iVar1;
  pointer __p_00;
  EC_KEY *eckey_00;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ECDSA_SIG *__p_01;
  char *message;
  _Head_base<0UL,_ec_key_st_*,_false> in_R9;
  __uniq_ptr_impl<ec_key_st,_bssl::internal::Deleter> _Var2;
  long lVar3;
  bool bVar4;
  ScopedTrace gtest_trace_163;
  AssertionResult gtest_ar__11;
  AssertHelper local_f8;
  AssertionResult gtest_ar_;
  UniquePtr<EC_KEY> eckey;
  AssertionResult gtest_ar;
  vector<unsigned_char,_std::allocator<unsigned_char>_> signature2;
  UniquePtr<ECDSA_SIG> ecdsa_sig;
  AssertHelper local_88;
  UniquePtr<EC_GROUP> group;
  UniquePtr<EC_KEY> wrong_eckey;
  uint sig_len;
  uint8_t digest [20];
  uint8_t wrong_digest [20];
  
  iVar1 = RAND_bytes(digest,0x14);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar_.success_ = iVar1 != 0;
  if (iVar1 == 0) {
    testing::Message::Message((Message *)&signature2);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&gtest_ar_,
               (AssertionResult *)"RAND_bytes(digest, 20)","false","true",(char *)in_R9._M_head_impl
              );
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__11,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ecdsa/ecdsa_test.cc"
               ,0x92,(char *)gtest_ar._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__11,(Message *)&signature2)
    ;
  }
  else {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
    iVar1 = RAND_bytes(wrong_digest,0x14);
    gtest_ar_.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    gtest_ar_.success_ = iVar1 != 0;
    if (gtest_ar_.success_) {
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar_.message_);
      lVar3 = 8;
      do {
        if (lVar3 == 0x58) {
          return;
        }
        testing::ScopedTrace::ScopedTrace
                  (&gtest_trace_163,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ecdsa/ecdsa_test.cc"
                   ,0xa3,*(char **)((long)&TestBody::kCurves[0].nid + lVar3));
        group._M_t.super___uniq_ptr_impl<ec_group_st,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_ec_group_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_ec_group_st_*,_false>._M_head_impl =
             (__uniq_ptr_data<ec_group_st,_bssl::internal::Deleter,_true,_true>)
             (__uniq_ptr_impl<ec_group_st,_bssl::internal::Deleter>)0x0;
        if (*(int *)((long)&PTR_typeinfo_00685538 + lVar3) == 0x2c5) {
          NewSecp160r1Group();
          __p = gtest_ar._0_8_;
          gtest_ar.success_ = false;
          gtest_ar._1_7_ = 0;
          std::__uniq_ptr_impl<ec_group_st,_bssl::internal::Deleter>::reset
                    ((__uniq_ptr_impl<ec_group_st,_bssl::internal::Deleter> *)&group,(pointer)__p);
          std::unique_ptr<ec_group_st,_bssl::internal::Deleter>::~unique_ptr
                    ((unique_ptr<ec_group_st,_bssl::internal::Deleter> *)&gtest_ar);
        }
        else {
          __p_00 = (pointer)EC_GROUP_new_by_curve_name
                                      (*(int *)((long)&PTR_typeinfo_00685538 + lVar3));
          std::__uniq_ptr_impl<ec_group_st,_bssl::internal::Deleter>::reset
                    ((__uniq_ptr_impl<ec_group_st,_bssl::internal::Deleter> *)&group,__p_00);
        }
        gtest_ar_.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )0x0;
        gtest_ar_.success_ =
             (__uniq_ptr_impl<ec_group_st,_bssl::internal::Deleter>)
             group._M_t.super___uniq_ptr_impl<ec_group_st,_bssl::internal::Deleter>._M_t.
             super__Tuple_impl<0UL,_ec_group_st_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_ec_group_st_*,_false>._M_head_impl !=
             (__uniq_ptr_impl<ec_group_st,_bssl::internal::Deleter>)0x0;
        if ((__uniq_ptr_impl<ec_group_st,_bssl::internal::Deleter>)
            group._M_t.super___uniq_ptr_impl<ec_group_st,_bssl::internal::Deleter>._M_t.
            super__Tuple_impl<0UL,_ec_group_st_*,_bssl::internal::Deleter>.
            super__Head_base<0UL,_ec_group_st_*,_false>._M_head_impl ==
            (__uniq_ptr_impl<ec_group_st,_bssl::internal::Deleter>)0x0) {
          testing::Message::Message((Message *)&signature2);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar,(internal *)&gtest_ar_,(AssertionResult *)0x51f425,"false",
                     "true",(char *)in_R9._M_head_impl);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar__11,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ecdsa/ecdsa_test.cc"
                     ,0xab,(char *)gtest_ar._0_8_);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar__11,(Message *)&signature2);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__11);
          std::__cxx11::string::~string((string *)&gtest_ar);
          if ((long *)CONCAT71(signature2.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start._1_7_,
                               signature2.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start._0_1_) != (long *)0x0) {
            (**(code **)(*(long *)CONCAT71(signature2.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                           signature2.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_start._0_1_) + 8))();
          }
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr(&gtest_ar_.message_);
          goto LAB_002b47eb;
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar_.message_);
        eckey_00 = (EC_KEY *)
                   EC_GROUP_get0_order((EC_GROUP *)
                                       group._M_t.
                                       super___uniq_ptr_impl<ec_group_st,_bssl::internal::Deleter>.
                                       _M_t.
                                       super__Tuple_impl<0UL,_ec_group_st_*,_bssl::internal::Deleter>
                                       .super__Head_base<0UL,_ec_group_st_*,_false>._M_head_impl);
        eckey._M_t.super___uniq_ptr_impl<ec_key_st,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_ec_key_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_ec_key_st_*,_false>._M_head_impl =
             (__uniq_ptr_data<ec_key_st,_bssl::internal::Deleter,_true,_true>)EC_KEY_new();
        gtest_ar_.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )0x0;
        gtest_ar_.success_ =
             (tuple<ec_key_st_*,_bssl::internal::Deleter>)
             eckey._M_t.super___uniq_ptr_impl<ec_key_st,_bssl::internal::Deleter>._M_t.
             super__Tuple_impl<0UL,_ec_key_st_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_ec_key_st_*,_false>._M_head_impl !=
             (_Head_base<0UL,_ec_key_st_*,_false>)0x0;
        if ((tuple<ec_key_st_*,_bssl::internal::Deleter>)
            eckey._M_t.super___uniq_ptr_impl<ec_key_st,_bssl::internal::Deleter>._M_t.
            super__Tuple_impl<0UL,_ec_key_st_*,_bssl::internal::Deleter>.
            super__Head_base<0UL,_ec_key_st_*,_false>._M_head_impl ==
            (_Head_base<0UL,_ec_key_st_*,_false>)0x0) {
          testing::Message::Message((Message *)&signature2);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar,(internal *)&gtest_ar_,(AssertionResult *)0x4c729c,"false",
                     "true",(char *)in_R9._M_head_impl);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar__11,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ecdsa/ecdsa_test.cc"
                     ,0xb0,(char *)gtest_ar._0_8_);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar__11,(Message *)&signature2);
LAB_002b465b:
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__11);
          std::__cxx11::string::~string((string *)&gtest_ar);
          if ((long *)CONCAT71(signature2.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start._1_7_,
                               signature2.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start._0_1_) != (long *)0x0) {
            (**(code **)(*(long *)CONCAT71(signature2.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                           signature2.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_start._0_1_) + 8))();
          }
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr(&gtest_ar_.message_);
LAB_002b47e1:
          std::unique_ptr<ec_key_st,_bssl::internal::Deleter>::~unique_ptr(&eckey);
LAB_002b47eb:
          std::unique_ptr<ec_group_st,_bssl::internal::Deleter>::~unique_ptr(&group);
          testing::ScopedTrace::~ScopedTrace(&gtest_trace_163);
          return;
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar_.message_);
        iVar1 = EC_KEY_set_group((EC_KEY *)
                                 eckey._M_t.
                                 super___uniq_ptr_impl<ec_key_st,_bssl::internal::Deleter>._M_t.
                                 super__Tuple_impl<0UL,_ec_key_st_*,_bssl::internal::Deleter>.
                                 super__Head_base<0UL,_ec_key_st_*,_false>._M_head_impl,
                                 (EC_GROUP *)
                                 group._M_t.
                                 super___uniq_ptr_impl<ec_group_st,_bssl::internal::Deleter>._M_t.
                                 super__Tuple_impl<0UL,_ec_group_st_*,_bssl::internal::Deleter>.
                                 super__Head_base<0UL,_ec_group_st_*,_false>._M_head_impl);
        gtest_ar_.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )0x0;
        gtest_ar_.success_ = iVar1 != 0;
        if (iVar1 == 0) {
          testing::Message::Message((Message *)&signature2);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar,(internal *)&gtest_ar_,
                     (AssertionResult *)"EC_KEY_set_group(eckey.get(), group.get())","false","true",
                     (char *)in_R9._M_head_impl);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar__11,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ecdsa/ecdsa_test.cc"
                     ,0xb1,(char *)gtest_ar._0_8_);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar__11,(Message *)&signature2);
          goto LAB_002b465b;
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar_.message_);
        iVar1 = EC_KEY_generate_key((EC_KEY *)
                                    eckey._M_t.
                                    super___uniq_ptr_impl<ec_key_st,_bssl::internal::Deleter>._M_t.
                                    super__Tuple_impl<0UL,_ec_key_st_*,_bssl::internal::Deleter>.
                                    super__Head_base<0UL,_ec_key_st_*,_false>._M_head_impl);
        gtest_ar_.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )0x0;
        gtest_ar_.success_ = iVar1 != 0;
        if (iVar1 == 0) {
          testing::Message::Message((Message *)&signature2);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar,(internal *)&gtest_ar_,
                     (AssertionResult *)"EC_KEY_generate_key(eckey.get())","false","true",
                     (char *)in_R9._M_head_impl);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar__11,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ecdsa/ecdsa_test.cc"
                     ,0xb2,(char *)gtest_ar._0_8_);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar__11,(Message *)&signature2);
          goto LAB_002b465b;
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar_.message_);
        wrong_eckey._M_t.super___uniq_ptr_impl<ec_key_st,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_ec_key_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_ec_key_st_*,_false>._M_head_impl =
             (__uniq_ptr_data<ec_key_st,_bssl::internal::Deleter,_true,_true>)EC_KEY_new();
        gtest_ar_.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )0x0;
        gtest_ar_.success_ =
             (tuple<ec_key_st_*,_bssl::internal::Deleter>)
             wrong_eckey._M_t.super___uniq_ptr_impl<ec_key_st,_bssl::internal::Deleter>._M_t.
             super__Tuple_impl<0UL,_ec_key_st_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_ec_key_st_*,_false>._M_head_impl !=
             (_Head_base<0UL,_ec_key_st_*,_false>)0x0;
        if ((tuple<ec_key_st_*,_bssl::internal::Deleter>)
            wrong_eckey._M_t.super___uniq_ptr_impl<ec_key_st,_bssl::internal::Deleter>._M_t.
            super__Tuple_impl<0UL,_ec_key_st_*,_bssl::internal::Deleter>.
            super__Head_base<0UL,_ec_key_st_*,_false>._M_head_impl ==
            (_Head_base<0UL,_ec_key_st_*,_false>)0x0) {
          testing::Message::Message((Message *)&signature2);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar,(internal *)&gtest_ar_,(AssertionResult *)"wrong_eckey",
                     "false","true",(char *)in_R9._M_head_impl);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar__11,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ecdsa/ecdsa_test.cc"
                     ,0xb6,(char *)gtest_ar._0_8_);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar__11,(Message *)&signature2);
LAB_002b47a6:
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__11);
          std::__cxx11::string::~string((string *)&gtest_ar);
          if ((long *)CONCAT71(signature2.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start._1_7_,
                               signature2.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start._0_1_) != (long *)0x0) {
            (**(code **)(*(long *)CONCAT71(signature2.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                           signature2.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_start._0_1_) + 8))();
          }
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr(&gtest_ar_.message_);
          std::unique_ptr<ec_key_st,_bssl::internal::Deleter>::~unique_ptr(&wrong_eckey);
          goto LAB_002b47e1;
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar_.message_);
        iVar1 = EC_KEY_set_group((EC_KEY *)
                                 wrong_eckey._M_t.
                                 super___uniq_ptr_impl<ec_key_st,_bssl::internal::Deleter>._M_t.
                                 super__Tuple_impl<0UL,_ec_key_st_*,_bssl::internal::Deleter>.
                                 super__Head_base<0UL,_ec_key_st_*,_false>._M_head_impl,
                                 (EC_GROUP *)
                                 group._M_t.
                                 super___uniq_ptr_impl<ec_group_st,_bssl::internal::Deleter>._M_t.
                                 super__Tuple_impl<0UL,_ec_group_st_*,_bssl::internal::Deleter>.
                                 super__Head_base<0UL,_ec_group_st_*,_false>._M_head_impl);
        gtest_ar_.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )0x0;
        gtest_ar_.success_ = iVar1 != 0;
        if (iVar1 == 0) {
          testing::Message::Message((Message *)&signature2);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar,(internal *)&gtest_ar_,
                     (AssertionResult *)"EC_KEY_set_group(wrong_eckey.get(), group.get())","false",
                     "true",(char *)in_R9._M_head_impl);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar__11,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ecdsa/ecdsa_test.cc"
                     ,0xb7,(char *)gtest_ar._0_8_);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar__11,(Message *)&signature2);
          goto LAB_002b47a6;
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar_.message_);
        iVar1 = EC_KEY_generate_key((EC_KEY *)
                                    wrong_eckey._M_t.
                                    super___uniq_ptr_impl<ec_key_st,_bssl::internal::Deleter>._M_t.
                                    super__Tuple_impl<0UL,_ec_key_st_*,_bssl::internal::Deleter>.
                                    super__Head_base<0UL,_ec_key_st_*,_false>._M_head_impl);
        gtest_ar_.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )0x0;
        gtest_ar_.success_ = iVar1 != 0;
        if (iVar1 == 0) {
          testing::Message::Message((Message *)&signature2);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar,(internal *)&gtest_ar_,
                     (AssertionResult *)"EC_KEY_generate_key(wrong_eckey.get())","false","true",
                     (char *)in_R9._M_head_impl);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar__11,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ecdsa/ecdsa_test.cc"
                     ,0xb8,(char *)gtest_ar._0_8_);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar__11,(Message *)&signature2);
          goto LAB_002b47a6;
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar_.message_);
        iVar1 = EC_KEY_check_key((EC_KEY *)
                                 eckey._M_t.
                                 super___uniq_ptr_impl<ec_key_st,_bssl::internal::Deleter>._M_t.
                                 super__Tuple_impl<0UL,_ec_key_st_*,_bssl::internal::Deleter>.
                                 super__Head_base<0UL,_ec_key_st_*,_false>._M_head_impl);
        gtest_ar_.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )0x0;
        gtest_ar_.success_ = iVar1 != 0;
        if (!gtest_ar_.success_) {
          testing::Message::Message((Message *)&signature2);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar,(internal *)&gtest_ar_,
                     (AssertionResult *)"EC_KEY_check_key(eckey.get())","false","true",
                     (char *)in_R9._M_head_impl);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar__11,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ecdsa/ecdsa_test.cc"
                     ,0xbb,(char *)gtest_ar._0_8_);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar__11,(Message *)&signature2);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__11);
          std::__cxx11::string::~string((string *)&gtest_ar);
          if ((long *)CONCAT71(signature2.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start._1_7_,
                               signature2.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start._0_1_) != (long *)0x0) {
            (**(code **)(*(long *)CONCAT71(signature2.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                           signature2.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_start._0_1_) + 8))();
          }
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar_.message_);
        iVar1 = ECDSA_size((EC_KEY *)
                           eckey._M_t.super___uniq_ptr_impl<ec_key_st,_bssl::internal::Deleter>._M_t
                           .super__Tuple_impl<0UL,_ec_key_st_*,_bssl::internal::Deleter>.
                           super__Head_base<0UL,_ec_key_st_*,_false>._M_head_impl);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar_,
                   CONCAT44(extraout_var,iVar1),(allocator_type *)&gtest_ar);
        in_R9._M_head_impl = (ec_key_st *)eckey;
        iVar1 = ECDSA_sign(0,digest,0x14,(uchar *)CONCAT71(gtest_ar_._1_7_,gtest_ar_.success_),
                           &sig_len,(EC_KEY *)
                                    eckey._M_t.
                                    super___uniq_ptr_impl<ec_key_st,_bssl::internal::Deleter>._M_t.
                                    super__Tuple_impl<0UL,_ec_key_st_*,_bssl::internal::Deleter>.
                                    super__Head_base<0UL,_ec_key_st_*,_false>._M_head_impl);
        signature2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        signature2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start._0_1_ = iVar1 != 0;
        if (iVar1 == 0) {
          testing::Message::Message((Message *)&gtest_ar__11);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar,(internal *)&signature2,
                     (AssertionResult *)
                     "ECDSA_sign(0, digest, 20, signature.data(), &sig_len, eckey.get())","false",
                     "true",(char *)in_R9._M_head_impl);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&ecdsa_sig,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ecdsa/ecdsa_test.cc"
                     ,0xc2,(char *)gtest_ar._0_8_);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&ecdsa_sig,(Message *)&gtest_ar__11);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&ecdsa_sig);
          std::__cxx11::string::~string((string *)&gtest_ar);
          if (gtest_ar__11._0_8_ != 0) {
            (**(code **)(*(long *)gtest_ar__11._0_8_ + 8))();
          }
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&signature2.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish);
          bVar4 = false;
        }
        else {
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&signature2.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar_,
                     (ulong)sig_len);
          iVar1 = ECDSA_size((EC_KEY *)
                             eckey._M_t.super___uniq_ptr_impl<ec_key_st,_bssl::internal::Deleter>.
                             _M_t.super__Tuple_impl<0UL,_ec_key_st_*,_bssl::internal::Deleter>.
                             super__Head_base<0UL,_ec_key_st_*,_false>._M_head_impl);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                    (&signature2,CONCAT44(extraout_var_00,iVar1),(allocator_type *)&gtest_ar);
          in_R9._M_head_impl = (ec_key_st *)eckey;
          iVar1 = ECDSA_sign(0,digest,0x14,
                             (uchar *)CONCAT71(signature2.
                                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                               ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                               signature2.
                                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                               ._M_impl.super__Vector_impl_data._M_start._0_1_),
                             &sig_len,(EC_KEY *)
                                      eckey._M_t.
                                      super___uniq_ptr_impl<ec_key_st,_bssl::internal::Deleter>._M_t
                                      .super__Tuple_impl<0UL,_ec_key_st_*,_bssl::internal::Deleter>.
                                      super__Head_base<0UL,_ec_key_st_*,_false>._M_head_impl);
          gtest_ar__11.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl =
               (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )0x0;
          gtest_ar__11.success_ = iVar1 != 0;
          if (iVar1 == 0) {
            testing::Message::Message((Message *)&ecdsa_sig);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&gtest_ar,(internal *)&gtest_ar__11,
                       (AssertionResult *)
                       "ECDSA_sign(0, digest, 20, signature2.data(), &sig_len, eckey.get())","false"
                       ,"true",(char *)in_R9._M_head_impl);
            testing::internal::AssertHelper::AssertHelper
                      (&local_f8,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ecdsa/ecdsa_test.cc"
                       ,0xc9,(char *)gtest_ar._0_8_);
            testing::internal::AssertHelper::operator=(&local_f8,(Message *)&ecdsa_sig);
            testing::internal::AssertHelper::~AssertHelper(&local_f8);
            std::__cxx11::string::~string((string *)&gtest_ar);
            if ((__uniq_ptr_impl<ecdsa_sig_st,_bssl::internal::Deleter>)
                ecdsa_sig._M_t.super___uniq_ptr_impl<ecdsa_sig_st,_bssl::internal::Deleter>._M_t.
                super__Tuple_impl<0UL,_ecdsa_sig_st_*,_bssl::internal::Deleter>.
                super__Head_base<0UL,_ecdsa_sig_st_*,_false>._M_head_impl !=
                (__uniq_ptr_impl<ecdsa_sig_st,_bssl::internal::Deleter>)0x0) {
              (**(code **)(*(long *)ecdsa_sig._M_t.
                                    super___uniq_ptr_impl<ecdsa_sig_st,_bssl::internal::Deleter>.
                                    _M_t.
                                    super__Tuple_impl<0UL,_ecdsa_sig_st_*,_bssl::internal::Deleter>.
                                    super__Head_base<0UL,_ecdsa_sig_st_*,_false>._M_head_impl + 8))
                        ();
            }
            std::
            unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~unique_ptr(&gtest_ar__11.message_);
            bVar4 = false;
          }
          else {
            std::
            unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~unique_ptr(&gtest_ar__11.message_);
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                      (&signature2,(ulong)sig_len);
            gtest_ar__11._0_8_ = CONCAT71(gtest_ar_._1_7_,gtest_ar_.success_);
            gtest_ar__11.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl =
                 (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                  )((long)gtest_ar_.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl - gtest_ar__11._0_8_);
            ecdsa_sig._M_t.super___uniq_ptr_impl<ecdsa_sig_st,_bssl::internal::Deleter>._M_t.
            super__Tuple_impl<0UL,_ecdsa_sig_st_*,_bssl::internal::Deleter>.
            super__Head_base<0UL,_ecdsa_sig_st_*,_false>._M_head_impl._1_7_ =
                 signature2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_start._1_7_;
            ecdsa_sig._M_t.super___uniq_ptr_impl<ecdsa_sig_st,_bssl::internal::Deleter>._M_t.
            super__Tuple_impl<0UL,_ecdsa_sig_st_*,_bssl::internal::Deleter>.
            super__Head_base<0UL,_ecdsa_sig_st_*,_false>._M_head_impl._0_1_ =
                 signature2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_start._0_1_;
            testing::internal::CmpHelperNE<Bytes,Bytes>
                      ((internal *)&gtest_ar,"Bytes(signature)","Bytes(signature2)",
                       (Bytes *)&gtest_ar__11,(Bytes *)&ecdsa_sig);
            if (gtest_ar.success_ == false) {
              testing::Message::Message((Message *)&gtest_ar__11);
              message = "";
              if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )gtest_ar.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl !=
                  (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )0x0) {
                message = *(char **)gtest_ar.message_._M_t.
                                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    .
                                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                    ._M_head_impl;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&ecdsa_sig,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ecdsa/ecdsa_test.cc"
                         ,0xcb,message);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&ecdsa_sig,(Message *)&gtest_ar__11);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&ecdsa_sig);
              if (gtest_ar__11._0_8_ != 0) {
                (**(code **)(*(long *)gtest_ar__11._0_8_ + 8))();
              }
            }
            std::
            unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~unique_ptr(&gtest_ar.message_);
            _Var2._M_t.super__Tuple_impl<0UL,_ec_key_st_*,_bssl::internal::Deleter>.
            super__Head_base<0UL,_ec_key_st_*,_false>._M_head_impl =
                 (tuple<ec_key_st_*,_bssl::internal::Deleter>)
                 (tuple<ec_key_st_*,_bssl::internal::Deleter>)eckey;
            iVar1 = ECDSA_verify(0,digest,0x14,(uchar *)CONCAT71(gtest_ar_._1_7_,gtest_ar_.success_)
                                 ,(int)gtest_ar_.message_._M_t.
                                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       .
                                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                       ._M_head_impl -
                                  (int)(uchar *)CONCAT71(gtest_ar_._1_7_,gtest_ar_.success_),
                                 (EC_KEY *)
                                 eckey._M_t.
                                 super___uniq_ptr_impl<ec_key_st,_bssl::internal::Deleter>._M_t.
                                 super__Tuple_impl<0UL,_ec_key_st_*,_bssl::internal::Deleter>.
                                 super__Head_base<0UL,_ec_key_st_*,_false>._M_head_impl);
            gtest_ar__11.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl =
                 (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                  )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )0x0;
            bVar4 = iVar1 != 0;
            gtest_ar__11.success_ = bVar4;
            if (!bVar4) {
              testing::Message::Message((Message *)&ecdsa_sig);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)&gtest_ar,(internal *)&gtest_ar__11,
                         (AssertionResult *)
                         "ECDSA_verify(0, digest, 20, signature.data(), signature.size(), eckey.get())"
                         ,"false","true",
                         (char *)_Var2._M_t.
                                 super__Tuple_impl<0UL,_ec_key_st_*,_bssl::internal::Deleter>.
                                 super__Head_base<0UL,_ec_key_st_*,_false>._M_head_impl);
              testing::internal::AssertHelper::AssertHelper
                        (&local_f8,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ecdsa/ecdsa_test.cc"
                         ,0xcf,(char *)gtest_ar._0_8_);
              testing::internal::AssertHelper::operator=(&local_f8,(Message *)&ecdsa_sig);
              testing::internal::AssertHelper::~AssertHelper(&local_f8);
              std::__cxx11::string::~string((string *)&gtest_ar);
              if ((__uniq_ptr_impl<ecdsa_sig_st,_bssl::internal::Deleter>)
                  ecdsa_sig._M_t.super___uniq_ptr_impl<ecdsa_sig_st,_bssl::internal::Deleter>._M_t.
                  super__Tuple_impl<0UL,_ecdsa_sig_st_*,_bssl::internal::Deleter>.
                  super__Head_base<0UL,_ecdsa_sig_st_*,_false>._M_head_impl !=
                  (__uniq_ptr_impl<ecdsa_sig_st,_bssl::internal::Deleter>)0x0) {
                (**(code **)(*(long *)ecdsa_sig._M_t.
                                      super___uniq_ptr_impl<ecdsa_sig_st,_bssl::internal::Deleter>.
                                      _M_t.
                                      super__Tuple_impl<0UL,_ecdsa_sig_st_*,_bssl::internal::Deleter>
                                      .super__Head_base<0UL,_ecdsa_sig_st_*,_false>._M_head_impl + 8
                            ))();
              }
            }
            std::
            unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~unique_ptr(&gtest_ar__11.message_);
            _Var2._M_t.super__Tuple_impl<0UL,_ec_key_st_*,_bssl::internal::Deleter>.
            super__Head_base<0UL,_ec_key_st_*,_false>._M_head_impl =
                 (tuple<ec_key_st_*,_bssl::internal::Deleter>)
                 (tuple<ec_key_st_*,_bssl::internal::Deleter>)wrong_eckey;
            iVar1 = ECDSA_verify(0,digest,0x14,(uchar *)CONCAT71(gtest_ar_._1_7_,gtest_ar_.success_)
                                 ,(int)gtest_ar_.message_._M_t.
                                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       .
                                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                       ._M_head_impl -
                                  (int)(uchar *)CONCAT71(gtest_ar_._1_7_,gtest_ar_.success_),
                                 (EC_KEY *)
                                 wrong_eckey._M_t.
                                 super___uniq_ptr_impl<ec_key_st,_bssl::internal::Deleter>._M_t.
                                 super__Tuple_impl<0UL,_ec_key_st_*,_bssl::internal::Deleter>.
                                 super__Head_base<0UL,_ec_key_st_*,_false>._M_head_impl);
            gtest_ar__11.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl =
                 (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                  )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )0x0;
            gtest_ar__11.success_ = iVar1 == 0;
            if (!gtest_ar__11.success_) {
              testing::Message::Message((Message *)&ecdsa_sig);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)&gtest_ar,(internal *)&gtest_ar__11,
                         (AssertionResult *)
                         "ECDSA_verify(0, digest, 20, signature.data(), signature.size(), wrong_eckey.get())"
                         ,"true","false",
                         (char *)_Var2._M_t.
                                 super__Tuple_impl<0UL,_ec_key_st_*,_bssl::internal::Deleter>.
                                 super__Head_base<0UL,_ec_key_st_*,_false>._M_head_impl);
              testing::internal::AssertHelper::AssertHelper
                        (&local_f8,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ecdsa/ecdsa_test.cc"
                         ,0xd3,(char *)gtest_ar._0_8_);
              testing::internal::AssertHelper::operator=(&local_f8,(Message *)&ecdsa_sig);
              testing::internal::AssertHelper::~AssertHelper(&local_f8);
              std::__cxx11::string::~string((string *)&gtest_ar);
              if ((__uniq_ptr_impl<ecdsa_sig_st,_bssl::internal::Deleter>)
                  ecdsa_sig._M_t.super___uniq_ptr_impl<ecdsa_sig_st,_bssl::internal::Deleter>._M_t.
                  super__Tuple_impl<0UL,_ecdsa_sig_st_*,_bssl::internal::Deleter>.
                  super__Head_base<0UL,_ecdsa_sig_st_*,_false>._M_head_impl !=
                  (__uniq_ptr_impl<ecdsa_sig_st,_bssl::internal::Deleter>)0x0) {
                (**(code **)(*(long *)ecdsa_sig._M_t.
                                      super___uniq_ptr_impl<ecdsa_sig_st,_bssl::internal::Deleter>.
                                      _M_t.
                                      super__Tuple_impl<0UL,_ecdsa_sig_st_*,_bssl::internal::Deleter>
                                      .super__Head_base<0UL,_ecdsa_sig_st_*,_false>._M_head_impl + 8
                            ))();
              }
            }
            std::
            unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~unique_ptr(&gtest_ar__11.message_);
            ERR_clear_error();
            _Var2._M_t.super__Tuple_impl<0UL,_ec_key_st_*,_bssl::internal::Deleter>.
            super__Head_base<0UL,_ec_key_st_*,_false>._M_head_impl =
                 (tuple<ec_key_st_*,_bssl::internal::Deleter>)
                 (tuple<ec_key_st_*,_bssl::internal::Deleter>)eckey;
            iVar1 = ECDSA_verify(0,wrong_digest,0x14,
                                 (uchar *)CONCAT71(gtest_ar_._1_7_,gtest_ar_.success_),
                                 (int)gtest_ar_.message_._M_t.
                                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                      ._M_head_impl -
                                 (int)(uchar *)CONCAT71(gtest_ar_._1_7_,gtest_ar_.success_),
                                 (EC_KEY *)
                                 eckey._M_t.
                                 super___uniq_ptr_impl<ec_key_st,_bssl::internal::Deleter>._M_t.
                                 super__Tuple_impl<0UL,_ec_key_st_*,_bssl::internal::Deleter>.
                                 super__Head_base<0UL,_ec_key_st_*,_false>._M_head_impl);
            gtest_ar__11.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl =
                 (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                  )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )0x0;
            gtest_ar__11.success_ = iVar1 == 0;
            if (!gtest_ar__11.success_) {
              testing::Message::Message((Message *)&ecdsa_sig);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)&gtest_ar,(internal *)&gtest_ar__11,
                         (AssertionResult *)
                         "ECDSA_verify(0, wrong_digest, 20, signature.data(), signature.size(), eckey.get())"
                         ,"true","false",
                         (char *)_Var2._M_t.
                                 super__Tuple_impl<0UL,_ec_key_st_*,_bssl::internal::Deleter>.
                                 super__Head_base<0UL,_ec_key_st_*,_false>._M_head_impl);
              testing::internal::AssertHelper::AssertHelper
                        (&local_f8,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ecdsa/ecdsa_test.cc"
                         ,0xd8,(char *)gtest_ar._0_8_);
              testing::internal::AssertHelper::operator=(&local_f8,(Message *)&ecdsa_sig);
              testing::internal::AssertHelper::~AssertHelper(&local_f8);
              std::__cxx11::string::~string((string *)&gtest_ar);
              if ((__uniq_ptr_impl<ecdsa_sig_st,_bssl::internal::Deleter>)
                  ecdsa_sig._M_t.super___uniq_ptr_impl<ecdsa_sig_st,_bssl::internal::Deleter>._M_t.
                  super__Tuple_impl<0UL,_ecdsa_sig_st_*,_bssl::internal::Deleter>.
                  super__Head_base<0UL,_ecdsa_sig_st_*,_false>._M_head_impl !=
                  (__uniq_ptr_impl<ecdsa_sig_st,_bssl::internal::Deleter>)0x0) {
                (**(code **)(*(long *)ecdsa_sig._M_t.
                                      super___uniq_ptr_impl<ecdsa_sig_st,_bssl::internal::Deleter>.
                                      _M_t.
                                      super__Tuple_impl<0UL,_ecdsa_sig_st_*,_bssl::internal::Deleter>
                                      .super__Head_base<0UL,_ecdsa_sig_st_*,_false>._M_head_impl + 8
                            ))();
              }
            }
            std::
            unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~unique_ptr(&gtest_ar__11.message_);
            ERR_clear_error();
            in_R9._M_head_impl = (ec_key_st *)eckey;
            iVar1 = ECDSA_verify(0,digest,0x14,(uchar *)CONCAT71(gtest_ar_._1_7_,gtest_ar_.success_)
                                 ,~(uint)(uchar *)CONCAT71(gtest_ar_._1_7_,gtest_ar_.success_) +
                                  (int)gtest_ar_.message_._M_t.
                                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       .
                                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                       ._M_head_impl,
                                 (EC_KEY *)
                                 eckey._M_t.
                                 super___uniq_ptr_impl<ec_key_st,_bssl::internal::Deleter>._M_t.
                                 super__Tuple_impl<0UL,_ec_key_st_*,_bssl::internal::Deleter>.
                                 super__Head_base<0UL,_ec_key_st_*,_false>._M_head_impl);
            gtest_ar__11.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl =
                 (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                  )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )0x0;
            gtest_ar__11.success_ = iVar1 == 0;
            if (!gtest_ar__11.success_) {
              testing::Message::Message((Message *)&ecdsa_sig);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)&gtest_ar,(internal *)&gtest_ar__11,
                         (AssertionResult *)
                         "ECDSA_verify(0, digest, 20, signature.data(), signature.size() - 1, eckey.get())"
                         ,"true","false",(char *)in_R9._M_head_impl);
              testing::internal::AssertHelper::AssertHelper
                        (&local_f8,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ecdsa/ecdsa_test.cc"
                         ,0xdd,(char *)gtest_ar._0_8_);
              testing::internal::AssertHelper::operator=(&local_f8,(Message *)&ecdsa_sig);
              testing::internal::AssertHelper::~AssertHelper(&local_f8);
              std::__cxx11::string::~string((string *)&gtest_ar);
              if ((__uniq_ptr_impl<ecdsa_sig_st,_bssl::internal::Deleter>)
                  ecdsa_sig._M_t.super___uniq_ptr_impl<ecdsa_sig_st,_bssl::internal::Deleter>._M_t.
                  super__Tuple_impl<0UL,_ecdsa_sig_st_*,_bssl::internal::Deleter>.
                  super__Head_base<0UL,_ecdsa_sig_st_*,_false>._M_head_impl !=
                  (__uniq_ptr_impl<ecdsa_sig_st,_bssl::internal::Deleter>)0x0) {
                (**(code **)(*(long *)ecdsa_sig._M_t.
                                      super___uniq_ptr_impl<ecdsa_sig_st,_bssl::internal::Deleter>.
                                      _M_t.
                                      super__Tuple_impl<0UL,_ecdsa_sig_st_*,_bssl::internal::Deleter>
                                      .super__Head_base<0UL,_ecdsa_sig_st_*,_false>._M_head_impl + 8
                            ))();
              }
            }
            std::
            unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~unique_ptr(&gtest_ar__11.message_);
            ERR_clear_error();
            ecdsa_sig._M_t.super___uniq_ptr_impl<ecdsa_sig_st,_bssl::internal::Deleter>._M_t.
            super__Tuple_impl<0UL,_ecdsa_sig_st_*,_bssl::internal::Deleter>.
            super__Head_base<0UL,_ecdsa_sig_st_*,_false>._M_head_impl =
                 (__uniq_ptr_data<ecdsa_sig_st,_bssl::internal::Deleter,_true,_true>)
                 ECDSA_SIG_from_bytes
                           ((uint8_t *)CONCAT71(gtest_ar_._1_7_,gtest_ar_.success_),
                            (long)gtest_ar_.message_._M_t.
                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                  ._M_head_impl - (long)CONCAT71(gtest_ar_._1_7_,gtest_ar_.success_)
                           );
            gtest_ar__11.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl =
                 (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                  )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )0x0;
            gtest_ar__11.success_ =
                 (tuple<ecdsa_sig_st_*,_bssl::internal::Deleter>)
                 ecdsa_sig._M_t.super___uniq_ptr_impl<ecdsa_sig_st,_bssl::internal::Deleter>._M_t.
                 super__Tuple_impl<0UL,_ecdsa_sig_st_*,_bssl::internal::Deleter>.
                 super__Head_base<0UL,_ecdsa_sig_st_*,_false>._M_head_impl !=
                 (_Head_base<0UL,_ecdsa_sig_st_*,_false>)0x0;
            if ((tuple<ecdsa_sig_st_*,_bssl::internal::Deleter>)
                ecdsa_sig._M_t.super___uniq_ptr_impl<ecdsa_sig_st,_bssl::internal::Deleter>._M_t.
                super__Tuple_impl<0UL,_ecdsa_sig_st_*,_bssl::internal::Deleter>.
                super__Head_base<0UL,_ecdsa_sig_st_*,_false>._M_head_impl ==
                (_Head_base<0UL,_ecdsa_sig_st_*,_false>)0x0) {
              testing::Message::Message((Message *)&local_f8);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)&gtest_ar,(internal *)&gtest_ar__11,
                         (AssertionResult *)"ecdsa_sig","false","true",(char *)in_R9._M_head_impl);
              testing::internal::AssertHelper::AssertHelper
                        (&local_88,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ecdsa/ecdsa_test.cc"
                         ,0xe3,(char *)gtest_ar._0_8_);
              testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_f8);
LAB_002b4345:
              testing::internal::AssertHelper::~AssertHelper(&local_88);
              std::__cxx11::string::~string((string *)&gtest_ar);
              if (local_f8.data_ != (AssertHelperData *)0x0) {
                (**(code **)(*(long *)local_f8.data_ + 8))();
              }
              std::
              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~unique_ptr(&gtest_ar__11.message_);
              bVar4 = false;
            }
            else {
              std::
              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~unique_ptr(&gtest_ar__11.message_);
              TestTamperedSig(kEncodedAPI,digest,
                              (size_t)ecdsa_sig._M_t.
                                      super___uniq_ptr_impl<ecdsa_sig_st,_bssl::internal::Deleter>.
                                      _M_t.
                                      super__Tuple_impl<0UL,_ecdsa_sig_st_*,_bssl::internal::Deleter>
                                      .super__Head_base<0UL,_ecdsa_sig_st_*,_false>._M_head_impl,
                              (ECDSA_SIG *)
                              eckey._M_t.super___uniq_ptr_impl<ec_key_st,_bssl::internal::Deleter>.
                              _M_t.super__Tuple_impl<0UL,_ec_key_st_*,_bssl::internal::Deleter>.
                              super__Head_base<0UL,_ec_key_st_*,_false>._M_head_impl,eckey_00,
                              (BIGNUM *)in_R9._M_head_impl);
              __p_01 = ECDSA_do_sign(digest,0x14,
                                     (EC_KEY *)
                                     eckey._M_t.
                                     super___uniq_ptr_impl<ec_key_st,_bssl::internal::Deleter>._M_t.
                                     super__Tuple_impl<0UL,_ec_key_st_*,_bssl::internal::Deleter>.
                                     super__Head_base<0UL,_ec_key_st_*,_false>._M_head_impl);
              std::__uniq_ptr_impl<ecdsa_sig_st,_bssl::internal::Deleter>::reset
                        ((__uniq_ptr_impl<ecdsa_sig_st,_bssl::internal::Deleter> *)&ecdsa_sig,
                         (pointer)__p_01);
              gtest_ar__11.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl =
                   (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                    )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )0x0;
              gtest_ar__11.success_ =
                   (__uniq_ptr_impl<ecdsa_sig_st,_bssl::internal::Deleter>)
                   ecdsa_sig._M_t.super___uniq_ptr_impl<ecdsa_sig_st,_bssl::internal::Deleter>._M_t.
                   super__Tuple_impl<0UL,_ecdsa_sig_st_*,_bssl::internal::Deleter>.
                   super__Head_base<0UL,_ecdsa_sig_st_*,_false>._M_head_impl !=
                   (__uniq_ptr_impl<ecdsa_sig_st,_bssl::internal::Deleter>)0x0;
              if ((__uniq_ptr_impl<ecdsa_sig_st,_bssl::internal::Deleter>)
                  ecdsa_sig._M_t.super___uniq_ptr_impl<ecdsa_sig_st,_bssl::internal::Deleter>._M_t.
                  super__Tuple_impl<0UL,_ecdsa_sig_st_*,_bssl::internal::Deleter>.
                  super__Head_base<0UL,_ecdsa_sig_st_*,_false>._M_head_impl ==
                  (__uniq_ptr_impl<ecdsa_sig_st,_bssl::internal::Deleter>)0x0) {
                testing::Message::Message((Message *)&local_f8);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)&gtest_ar,(internal *)&gtest_ar__11,
                           (AssertionResult *)"ecdsa_sig","false","true",(char *)in_R9._M_head_impl)
                ;
                testing::internal::AssertHelper::AssertHelper
                          (&local_88,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ecdsa/ecdsa_test.cc"
                           ,0xea,(char *)gtest_ar._0_8_);
                testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_f8);
                goto LAB_002b4345;
              }
              std::
              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~unique_ptr(&gtest_ar__11.message_);
              iVar1 = ECDSA_do_verify(digest,0x14,
                                      (ECDSA_SIG *)
                                      ecdsa_sig._M_t.
                                      super___uniq_ptr_impl<ecdsa_sig_st,_bssl::internal::Deleter>.
                                      _M_t.
                                      super__Tuple_impl<0UL,_ecdsa_sig_st_*,_bssl::internal::Deleter>
                                      .super__Head_base<0UL,_ecdsa_sig_st_*,_false>._M_head_impl,
                                      (EC_KEY *)
                                      eckey._M_t.
                                      super___uniq_ptr_impl<ec_key_st,_bssl::internal::Deleter>._M_t
                                      .super__Tuple_impl<0UL,_ec_key_st_*,_bssl::internal::Deleter>.
                                      super__Head_base<0UL,_ec_key_st_*,_false>._M_head_impl);
              gtest_ar__11.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl =
                   (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                    )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )0x0;
              bVar4 = iVar1 != 0;
              gtest_ar__11.success_ = bVar4;
              if (!bVar4) {
                testing::Message::Message((Message *)&local_f8);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)&gtest_ar,(internal *)&gtest_ar__11,
                           (AssertionResult *)
                           "ECDSA_do_verify(digest, 20, ecdsa_sig.get(), eckey.get())","false",
                           "true",(char *)in_R9._M_head_impl);
                testing::internal::AssertHelper::AssertHelper
                          (&local_88,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ecdsa/ecdsa_test.cc"
                           ,0xed,(char *)gtest_ar._0_8_);
                testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_f8);
                testing::internal::AssertHelper::~AssertHelper(&local_88);
                std::__cxx11::string::~string((string *)&gtest_ar);
                if (local_f8.data_ != (AssertHelperData *)0x0) {
                  (**(code **)(*(long *)local_f8.data_ + 8))();
                }
              }
              std::
              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~unique_ptr(&gtest_ar__11.message_);
              iVar1 = ECDSA_do_verify(digest,0x14,
                                      (ECDSA_SIG *)
                                      ecdsa_sig._M_t.
                                      super___uniq_ptr_impl<ecdsa_sig_st,_bssl::internal::Deleter>.
                                      _M_t.
                                      super__Tuple_impl<0UL,_ecdsa_sig_st_*,_bssl::internal::Deleter>
                                      .super__Head_base<0UL,_ecdsa_sig_st_*,_false>._M_head_impl,
                                      (EC_KEY *)
                                      wrong_eckey._M_t.
                                      super___uniq_ptr_impl<ec_key_st,_bssl::internal::Deleter>._M_t
                                      .super__Tuple_impl<0UL,_ec_key_st_*,_bssl::internal::Deleter>.
                                      super__Head_base<0UL,_ec_key_st_*,_false>._M_head_impl);
              gtest_ar__11.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl =
                   (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                    )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )0x0;
              gtest_ar__11.success_ = iVar1 == 0;
              if (!gtest_ar__11.success_) {
                testing::Message::Message((Message *)&local_f8);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)&gtest_ar,(internal *)&gtest_ar__11,
                           (AssertionResult *)
                           "ECDSA_do_verify(digest, 20, ecdsa_sig.get(), wrong_eckey.get())","true",
                           "false",(char *)in_R9._M_head_impl);
                testing::internal::AssertHelper::AssertHelper
                          (&local_88,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ecdsa/ecdsa_test.cc"
                           ,0xf1,(char *)gtest_ar._0_8_);
                testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_f8);
                testing::internal::AssertHelper::~AssertHelper(&local_88);
                std::__cxx11::string::~string((string *)&gtest_ar);
                if (local_f8.data_ != (AssertHelperData *)0x0) {
                  (**(code **)(*(long *)local_f8.data_ + 8))();
                }
              }
              std::
              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~unique_ptr(&gtest_ar__11.message_);
              ERR_clear_error();
              iVar1 = ECDSA_do_verify(wrong_digest,0x14,
                                      (ECDSA_SIG *)
                                      ecdsa_sig._M_t.
                                      super___uniq_ptr_impl<ecdsa_sig_st,_bssl::internal::Deleter>.
                                      _M_t.
                                      super__Tuple_impl<0UL,_ecdsa_sig_st_*,_bssl::internal::Deleter>
                                      .super__Head_base<0UL,_ecdsa_sig_st_*,_false>._M_head_impl,
                                      (EC_KEY *)
                                      eckey._M_t.
                                      super___uniq_ptr_impl<ec_key_st,_bssl::internal::Deleter>._M_t
                                      .super__Tuple_impl<0UL,_ec_key_st_*,_bssl::internal::Deleter>.
                                      super__Head_base<0UL,_ec_key_st_*,_false>._M_head_impl);
              gtest_ar__11.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl =
                   (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                    )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )0x0;
              gtest_ar__11.success_ = iVar1 == 0;
              if (!gtest_ar__11.success_) {
                testing::Message::Message((Message *)&local_f8);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)&gtest_ar,(internal *)&gtest_ar__11,
                           (AssertionResult *)
                           "ECDSA_do_verify(wrong_digest, 20, ecdsa_sig.get(), eckey.get())","true",
                           "false",(char *)in_R9._M_head_impl);
                testing::internal::AssertHelper::AssertHelper
                          (&local_88,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ecdsa/ecdsa_test.cc"
                           ,0xf6,(char *)gtest_ar._0_8_);
                testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_f8);
                testing::internal::AssertHelper::~AssertHelper(&local_88);
                std::__cxx11::string::~string((string *)&gtest_ar);
                if (local_f8.data_ != (AssertHelperData *)0x0) {
                  (**(code **)(*(long *)local_f8.data_ + 8))();
                }
              }
              std::
              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~unique_ptr(&gtest_ar__11.message_);
              ERR_clear_error();
              TestTamperedSig(kRawAPI,digest,
                              (size_t)ecdsa_sig._M_t.
                                      super___uniq_ptr_impl<ecdsa_sig_st,_bssl::internal::Deleter>.
                                      _M_t.
                                      super__Tuple_impl<0UL,_ecdsa_sig_st_*,_bssl::internal::Deleter>
                                      .super__Head_base<0UL,_ecdsa_sig_st_*,_false>._M_head_impl,
                              (ECDSA_SIG *)
                              eckey._M_t.super___uniq_ptr_impl<ec_key_st,_bssl::internal::Deleter>.
                              _M_t.super__Tuple_impl<0UL,_ec_key_st_*,_bssl::internal::Deleter>.
                              super__Head_base<0UL,_ec_key_st_*,_false>._M_head_impl,eckey_00,
                              (BIGNUM *)in_R9._M_head_impl);
              BN_set_negative(*(BIGNUM **)
                               ecdsa_sig._M_t.
                               super___uniq_ptr_impl<ecdsa_sig_st,_bssl::internal::Deleter>._M_t.
                               super__Tuple_impl<0UL,_ecdsa_sig_st_*,_bssl::internal::Deleter>.
                               super__Head_base<0UL,_ecdsa_sig_st_*,_false>._M_head_impl,1);
              iVar1 = ECDSA_do_verify(digest,0x14,
                                      (ECDSA_SIG *)
                                      ecdsa_sig._M_t.
                                      super___uniq_ptr_impl<ecdsa_sig_st,_bssl::internal::Deleter>.
                                      _M_t.
                                      super__Tuple_impl<0UL,_ecdsa_sig_st_*,_bssl::internal::Deleter>
                                      .super__Head_base<0UL,_ecdsa_sig_st_*,_false>._M_head_impl,
                                      (EC_KEY *)
                                      eckey._M_t.
                                      super___uniq_ptr_impl<ec_key_st,_bssl::internal::Deleter>._M_t
                                      .super__Tuple_impl<0UL,_ec_key_st_*,_bssl::internal::Deleter>.
                                      super__Head_base<0UL,_ec_key_st_*,_false>._M_head_impl);
              gtest_ar__11.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl =
                   (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                    )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )0x0;
              gtest_ar__11.success_ = iVar1 == 0;
              if (!gtest_ar__11.success_) {
                testing::Message::Message((Message *)&local_f8);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)&gtest_ar,(internal *)&gtest_ar__11,
                           (AssertionResult *)
                           "ECDSA_do_verify(digest, 20, ecdsa_sig.get(), eckey.get())","true",
                           "false",(char *)in_R9._M_head_impl);
                testing::internal::AssertHelper::AssertHelper
                          (&local_88,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ecdsa/ecdsa_test.cc"
                           ,0xfe,(char *)gtest_ar._0_8_);
                testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_f8);
                testing::internal::AssertHelper::~AssertHelper(&local_88);
                std::__cxx11::string::~string((string *)&gtest_ar);
                if (local_f8.data_ != (AssertHelperData *)0x0) {
                  (**(code **)(*(long *)local_f8.data_ + 8))();
                }
              }
              std::
              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~unique_ptr(&gtest_ar__11.message_);
              BN_set_negative(*(BIGNUM **)
                               ecdsa_sig._M_t.
                               super___uniq_ptr_impl<ecdsa_sig_st,_bssl::internal::Deleter>._M_t.
                               super__Tuple_impl<0UL,_ecdsa_sig_st_*,_bssl::internal::Deleter>.
                               super__Head_base<0UL,_ecdsa_sig_st_*,_false>._M_head_impl,0);
              BN_set_negative(*(BIGNUM **)
                               ((long)ecdsa_sig._M_t.
                                      super___uniq_ptr_impl<ecdsa_sig_st,_bssl::internal::Deleter>.
                                      _M_t.
                                      super__Tuple_impl<0UL,_ecdsa_sig_st_*,_bssl::internal::Deleter>
                                      .super__Head_base<0UL,_ecdsa_sig_st_*,_false>._M_head_impl + 8
                               ),1);
              iVar1 = ECDSA_do_verify(digest,0x14,
                                      (ECDSA_SIG *)
                                      ecdsa_sig._M_t.
                                      super___uniq_ptr_impl<ecdsa_sig_st,_bssl::internal::Deleter>.
                                      _M_t.
                                      super__Tuple_impl<0UL,_ecdsa_sig_st_*,_bssl::internal::Deleter>
                                      .super__Head_base<0UL,_ecdsa_sig_st_*,_false>._M_head_impl,
                                      (EC_KEY *)
                                      eckey._M_t.
                                      super___uniq_ptr_impl<ec_key_st,_bssl::internal::Deleter>._M_t
                                      .super__Tuple_impl<0UL,_ec_key_st_*,_bssl::internal::Deleter>.
                                      super__Head_base<0UL,_ec_key_st_*,_false>._M_head_impl);
              gtest_ar__11.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl =
                   (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                    )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )0x0;
              gtest_ar__11.success_ = iVar1 == 0;
              if (iVar1 != 0) {
                testing::Message::Message((Message *)&local_f8);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)&gtest_ar,(internal *)&gtest_ar__11,
                           (AssertionResult *)
                           "ECDSA_do_verify(digest, 20, ecdsa_sig.get(), eckey.get())","true",
                           "false",(char *)in_R9._M_head_impl);
                testing::internal::AssertHelper::AssertHelper
                          (&local_88,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ecdsa/ecdsa_test.cc"
                           ,0x101,(char *)gtest_ar._0_8_);
                testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_f8);
                testing::internal::AssertHelper::~AssertHelper(&local_88);
                std::__cxx11::string::~string((string *)&gtest_ar);
                if (local_f8.data_ != (AssertHelperData *)0x0) {
                  (**(code **)(*(long *)local_f8.data_ + 8))();
                }
              }
              std::
              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~unique_ptr(&gtest_ar__11.message_);
              bVar4 = true;
              BN_set_negative(*(BIGNUM **)
                               ((long)ecdsa_sig._M_t.
                                      super___uniq_ptr_impl<ecdsa_sig_st,_bssl::internal::Deleter>.
                                      _M_t.
                                      super__Tuple_impl<0UL,_ecdsa_sig_st_*,_bssl::internal::Deleter>
                                      .super__Head_base<0UL,_ecdsa_sig_st_*,_false>._M_head_impl + 8
                               ),0);
            }
            std::unique_ptr<ecdsa_sig_st,_bssl::internal::Deleter>::~unique_ptr
                      ((unique_ptr<ecdsa_sig_st,_bssl::internal::Deleter> *)&ecdsa_sig);
          }
          std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                    (&signature2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
        }
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar_);
        std::unique_ptr<ec_key_st,_bssl::internal::Deleter>::~unique_ptr(&wrong_eckey);
        std::unique_ptr<ec_key_st,_bssl::internal::Deleter>::~unique_ptr(&eckey);
        std::unique_ptr<ec_group_st,_bssl::internal::Deleter>::~unique_ptr(&group);
        testing::ScopedTrace::~ScopedTrace(&gtest_trace_163);
        lVar3 = lVar3 + 0x10;
        if (!bVar4) {
          return;
        }
      } while( true );
    }
    testing::Message::Message((Message *)&signature2);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&gtest_ar_,
               (AssertionResult *)"RAND_bytes(wrong_digest, 20)","false","true",
               (char *)in_R9._M_head_impl);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__11,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ecdsa/ecdsa_test.cc"
               ,0x94,(char *)gtest_ar._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__11,(Message *)&signature2)
    ;
  }
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__11);
  std::__cxx11::string::~string((string *)&gtest_ar);
  if ((long *)CONCAT71(signature2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start._1_7_,
                       signature2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start._0_1_) != (long *)0x0) {
    (**(code **)(*(long *)CONCAT71(signature2.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                   signature2.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_start._0_1_) + 8))();
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  return;
}

Assistant:

TEST(ECDSATest, BuiltinCurves) {
  // Fill digest values with some random data.
  uint8_t digest[20], wrong_digest[20];
  ASSERT_TRUE(RAND_bytes(digest, 20));
  CONSTTIME_DECLASSIFY(digest, 20);
  ASSERT_TRUE(RAND_bytes(wrong_digest, 20));
  CONSTTIME_DECLASSIFY(wrong_digest, 20);

  static const struct {
    int nid;
    const char *name;
  } kCurves[] = {
      { NID_secp224r1, "secp224r1" },
      { NID_X9_62_prime256v1, "secp256r1" },
      { NID_secp384r1, "secp384r1" },
      { NID_secp521r1, "secp521r1" },
      { NID_secp160r1, "secp160r1" },
  };

  for (const auto &curve : kCurves) {
    SCOPED_TRACE(curve.name);

    bssl::UniquePtr<EC_GROUP> group;
    if (curve.nid == NID_secp160r1) {
      group = NewSecp160r1Group();
    } else {
      group.reset(EC_GROUP_new_by_curve_name(curve.nid));
    }
    ASSERT_TRUE(group);
    const BIGNUM *order = EC_GROUP_get0_order(group.get());

    // Create a new ECDSA key.
    bssl::UniquePtr<EC_KEY> eckey(EC_KEY_new());
    ASSERT_TRUE(eckey);
    ASSERT_TRUE(EC_KEY_set_group(eckey.get(), group.get()));
    ASSERT_TRUE(EC_KEY_generate_key(eckey.get()));

    // Create a second key.
    bssl::UniquePtr<EC_KEY> wrong_eckey(EC_KEY_new());
    ASSERT_TRUE(wrong_eckey);
    ASSERT_TRUE(EC_KEY_set_group(wrong_eckey.get(), group.get()));
    ASSERT_TRUE(EC_KEY_generate_key(wrong_eckey.get()));

    // Check the key.
    EXPECT_TRUE(EC_KEY_check_key(eckey.get()));

    // Test ASN.1-encoded signatures.
    // Create a signature.
    std::vector<uint8_t> signature(ECDSA_size(eckey.get()));
    unsigned sig_len;
    ASSERT_TRUE(
        ECDSA_sign(0, digest, 20, signature.data(), &sig_len, eckey.get()));
    signature.resize(sig_len);

    // ECDSA signing should be non-deterministic. This does not verify k is
    // generated securely but at least checks it was randomized at all.
    std::vector<uint8_t> signature2(ECDSA_size(eckey.get()));
    ASSERT_TRUE(
        ECDSA_sign(0, digest, 20, signature2.data(), &sig_len, eckey.get()));
    signature2.resize(sig_len);
    EXPECT_NE(Bytes(signature), Bytes(signature2));

    // Verify the signature.
    EXPECT_TRUE(ECDSA_verify(0, digest, 20, signature.data(), signature.size(),
                             eckey.get()));

    // Verify the signature with the wrong key.
    EXPECT_FALSE(ECDSA_verify(0, digest, 20, signature.data(), signature.size(),
                              wrong_eckey.get()));
    ERR_clear_error();

    // Verify the signature using the wrong digest.
    EXPECT_FALSE(ECDSA_verify(0, wrong_digest, 20, signature.data(),
                              signature.size(), eckey.get()));
    ERR_clear_error();

    // Verify a truncated signature.
    EXPECT_FALSE(ECDSA_verify(0, digest, 20, signature.data(),
                              signature.size() - 1, eckey.get()));
    ERR_clear_error();

    // Verify a tampered signature.
    bssl::UniquePtr<ECDSA_SIG> ecdsa_sig(
        ECDSA_SIG_from_bytes(signature.data(), signature.size()));
    ASSERT_TRUE(ecdsa_sig);
    TestTamperedSig(kEncodedAPI, digest, 20, ecdsa_sig.get(), eckey.get(),
                    order);

    // Test ECDSA_SIG signing and verification.
    // Create a signature.
    ecdsa_sig.reset(ECDSA_do_sign(digest, 20, eckey.get()));
    ASSERT_TRUE(ecdsa_sig);

    // Verify the signature using the correct key.
    EXPECT_TRUE(ECDSA_do_verify(digest, 20, ecdsa_sig.get(), eckey.get()));

    // Verify the signature with the wrong key.
    EXPECT_FALSE(
        ECDSA_do_verify(digest, 20, ecdsa_sig.get(), wrong_eckey.get()));
    ERR_clear_error();

    // Verify the signature using the wrong digest.
    EXPECT_FALSE(
        ECDSA_do_verify(wrong_digest, 20, ecdsa_sig.get(), eckey.get()));
    ERR_clear_error();

    // Verify a tampered signature.
    TestTamperedSig(kRawAPI, digest, 20, ecdsa_sig.get(), eckey.get(), order);

    // Negative components should not be accepted.
    BN_set_negative(ecdsa_sig->r, 1);
    EXPECT_FALSE(ECDSA_do_verify(digest, 20, ecdsa_sig.get(), eckey.get()));
    BN_set_negative(ecdsa_sig->r, 0);
    BN_set_negative(ecdsa_sig->s, 1);
    EXPECT_FALSE(ECDSA_do_verify(digest, 20, ecdsa_sig.get(), eckey.get()));
    BN_set_negative(ecdsa_sig->s, 0);
  }
}